

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_version.c
# Opt level: O1

SUNErrCode SUNDIALSGetVersionNumber(int *major,int *minor,int *patch,char *label,int len)

{
  undefined4 in_EAX;
  int iVar1;
  SUNErrCode SVar2;
  undefined1 auVar3 [16];
  
  auVar3._0_4_ = -(uint)(major == (int *)0x0);
  auVar3._4_4_ = -(uint)(minor == (int *)0x0);
  auVar3._8_4_ = -(uint)(patch == (int *)0x0);
  auVar3._12_4_ = -(uint)(label == (char *)0x0);
  iVar1 = movmskps(in_EAX,auVar3);
  SVar2 = -9999;
  if (iVar1 == 0) {
    if (len == 0) {
      SVar2 = -0x270d;
    }
    else {
      *major = 7;
      *minor = 3;
      *patch = 0;
      SVar2 = 0;
      memset(label,0,(long)len);
    }
  }
  return SVar2;
}

Assistant:

SUNErrCode SUNDIALSGetVersionNumber(int* major, int* minor, int* patch,
                                    char* label, int len)
{
  if (major == NULL || minor == NULL || patch == NULL || label == NULL)
  {
    return SUN_ERR_ARG_CORRUPT;
  }
  if (strlen(SUNDIALS_VERSION_LABEL) >= (size_t)len)
  {
    return SUN_ERR_ARG_OUTOFRANGE;
  }

  *major = SUNDIALS_VERSION_MAJOR;
  *minor = SUNDIALS_VERSION_MINOR;
  *patch = SUNDIALS_VERSION_PATCH;
  strncpy(label, SUNDIALS_VERSION_LABEL, (size_t)len);

  return SUN_SUCCESS;
}